

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

int ConvexDecomposition::AssertIntact(ConvexH *convex)

{
  Array<ConvexDecomposition::ConvexH::HalfEdge> *this;
  Array<ConvexDecomposition::Plane> *this_00;
  uchar uVar1;
  short sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  HalfEdge *pHVar6;
  Plane *pPVar7;
  float3 *pfVar8;
  float3 *v1;
  float3 *v2;
  int iVar9;
  int iVar10;
  int i;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [64];
  float3 fVar15;
  undefined1 auVar14 [56];
  
  this = &convex->edges;
  i = 0;
  iVar10 = 0;
  while (iVar5 = (convex->edges).count, iVar10 < iVar5) {
    pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,i);
    uVar1 = pHVar6->p;
    pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar10);
    if (uVar1 != pHVar6->p) {
      i = iVar10;
    }
    iVar5 = iVar10 + 1;
    if (iVar5 < (convex->edges).count) {
      pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar5);
      uVar1 = pHVar6->p;
      pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar10);
      iVar9 = iVar5;
      if (uVar1 != pHVar6->p) goto LAB_00e283c3;
    }
    else {
LAB_00e283c3:
      iVar9 = i;
    }
    pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar9);
    uVar1 = pHVar6->p;
    pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar10);
    if (uVar1 != pHVar6->p) {
      __assert_fail("convex.edges[inext].p == convex.edges[i].p",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x6c1,"int ConvexDecomposition::AssertIntact(ConvexH &)");
    }
    pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar10);
    sVar2 = pHVar6->ea;
    if (sVar2 == -1) {
      return 0;
    }
    if (sVar2 == 0xff) {
      __assert_fail("nb!=255",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x6c3,"int ConvexDecomposition::AssertIntact(ConvexH &)");
    }
    pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,(int)sVar2);
    bVar11 = iVar10 != pHVar6->ea;
    iVar10 = iVar5;
    if (bVar11) {
      __assert_fail("i== convex.edges[nb].ea",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x6c6,"int ConvexDecomposition::AssertIntact(ConvexH &)");
    }
  }
  this_00 = &convex->facets;
  iVar10 = 0;
  do {
    if (iVar5 <= iVar10) {
      return 1;
    }
    pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar10);
    pPVar7 = Array<ConvexDecomposition::Plane>::operator[](this_00,(uint)pHVar6->p);
    pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar10);
    pfVar8 = Array<ConvexDecomposition::float3>::operator[](&convex->vertices,(uint)pHVar6->v);
    iVar5 = PlaneTest(pPVar7,pfVar8);
    if (iVar5 != 0) {
      __assert_fail("COPLANAR==PlaneTest(convex.facets[convex.edges[i].p],convex.vertices[convex.edges[i].v])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x6c9,"int ConvexDecomposition::AssertIntact(ConvexH &)");
    }
    pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar10);
    pPVar7 = Array<ConvexDecomposition::Plane>::operator[](this_00,(uint)pHVar6->p);
    pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar10);
    pfVar8 = Array<ConvexDecomposition::float3>::operator[](&convex->vertices,(uint)pHVar6->v);
    iVar5 = PlaneTest(pPVar7,pfVar8);
    if (iVar5 != 0) {
      return 0;
    }
    pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,i);
    uVar1 = pHVar6->p;
    pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar10);
    if (uVar1 != pHVar6->p) {
      i = iVar10;
    }
    iVar5 = iVar10 + 1;
    if (iVar5 < (convex->edges).count) {
      pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar5);
      uVar1 = pHVar6->p;
      pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar10);
      if (uVar1 != pHVar6->p) goto LAB_00e2853b;
    }
    else {
LAB_00e2853b:
      iVar5 = i;
    }
    iVar9 = iVar5 + 1;
    if (iVar9 < (convex->edges).count) {
      pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar9);
      uVar1 = pHVar6->p;
      pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar10);
      if (uVar1 != pHVar6->p) goto LAB_00e28570;
    }
    else {
LAB_00e28570:
      iVar9 = i;
    }
    auVar14 = in_ZMM0._8_56_;
    if (iVar10 != iVar9) {
      pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar10);
      pfVar8 = Array<ConvexDecomposition::float3>::operator[](&convex->vertices,(uint)pHVar6->v);
      pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar5);
      v1 = Array<ConvexDecomposition::float3>::operator[](&convex->vertices,(uint)pHVar6->v);
      pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar9);
      v2 = Array<ConvexDecomposition::float3>::operator[](&convex->vertices,(uint)pHVar6->v);
      fVar15 = TriNormal(pfVar8,v1,v2);
      auVar13._0_8_ = fVar15._0_8_;
      auVar13._8_56_ = auVar14;
      auVar12 = auVar13._0_16_;
      pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar10);
      pPVar7 = Array<ConvexDecomposition::Plane>::operator[](this_00,(uint)pHVar6->p);
      auVar3 = vmovshdup_avx(auVar12);
      auVar4 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ * (pPVar7->normal).y)),auVar12,
                               ZEXT416((uint)(pPVar7->normal).x));
      auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar15.z),ZEXT416((uint)(pPVar7->normal).z));
      if (auVar4._0_4_ <= 0.0) {
        __assert_fail("dot(localnormal,convex.facets[convex.edges[i].p].normal)>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                      ,0x6da,"int ConvexDecomposition::AssertIntact(ConvexH &)");
      }
      pHVar6 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this,iVar10);
      pPVar7 = Array<ConvexDecomposition::Plane>::operator[](this_00,(uint)pHVar6->p);
      auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ * (pPVar7->normal).y)),auVar12,
                               ZEXT416((uint)(pPVar7->normal).x));
      auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)fVar15.z),ZEXT416((uint)(pPVar7->normal).z));
      in_ZMM0 = ZEXT1664(auVar3);
      if (auVar3._0_4_ <= 0.0) {
        return 0;
      }
    }
    iVar5 = (convex->edges).count;
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

int AssertIntact(ConvexH &convex) {
	int i;
	int estart=0;
	for(i=0;i<convex.edges.count;i++) {
		if(convex.edges[estart].p!= convex.edges[i].p) {
			estart=i;
		}
		int inext = i+1;
		if(inext>= convex.edges.count || convex.edges[inext].p != convex.edges[i].p) {
			inext = estart;
		}
		assert(convex.edges[inext].p == convex.edges[i].p);
		int nb = convex.edges[i].ea;
		assert(nb!=255);
		if(nb==255 || nb==-1) return 0;
		assert(nb!=-1);
		assert(i== convex.edges[nb].ea);
	}
	for(i=0;i<convex.edges.count;i++) {
		assert(COPLANAR==PlaneTest(convex.facets[convex.edges[i].p],convex.vertices[convex.edges[i].v]));
		if(COPLANAR!=PlaneTest(convex.facets[convex.edges[i].p],convex.vertices[convex.edges[i].v])) return 0;
		if(convex.edges[estart].p!= convex.edges[i].p) {
			estart=i;
		}
		int i1 = i+1;
		if(i1>= convex.edges.count || convex.edges[i1].p != convex.edges[i].p) {
			i1 = estart;
		}
		int i2 = i1+1;
		if(i2>= convex.edges.count || convex.edges[i2].p != convex.edges[i].p) {
			i2 = estart;
		}
		if(i==i2) continue; // i sliced tangent to an edge and created 2 meaningless edges
		REAL3 localnormal = TriNormal(convex.vertices[convex.edges[i ].v],
			                           convex.vertices[convex.edges[i1].v],
			                           convex.vertices[convex.edges[i2].v]);
		assert(dot(localnormal,convex.facets[convex.edges[i].p].normal)>0);
		if(dot(localnormal,convex.facets[convex.edges[i].p].normal)<=0)return 0;
	}
	return 1;
}